

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::load(XMLLoader *this,FileName *fileName,AffineSpace3fa *space)

{
  SharedState state;
  XMLLoader loader;
  SharedState local_190;
  XMLLoader local_d0;
  
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  XMLLoader(&local_d0,fileName,space,&local_190);
  (this->path).filename._M_dataplus._M_p = (pointer)local_d0.root.ptr;
  if (local_d0.root.ptr != (Node *)0x0) {
    (*((local_d0.root.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  ~XMLLoader(&local_d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  ::~_Rb_tree(&local_190.textureMap._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  ::~_Rb_tree(&local_190.sceneMap._M_t);
  std::
  _Rb_tree<embree::Ref<embree::XML>,_std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  ::~_Rb_tree(&local_190.materialCache._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               *)&local_190);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::load(const FileName& fileName, const AffineSpace3fa& space)
  {
    SharedState state;
    XMLLoader loader(fileName,space,state); return loader.root;
  }